

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_arg.cc
# Opt level: O2

void __thiscall BuiltinFuncArg::PrintCDef(BuiltinFuncArg *this,FILE *fp,int n)

{
  char buf [1024];
  
  fprintf((FILE *)fp,"\t%s %s = (%s) (",builtin_func_arg_type[this->type].c_type,this->name,
          builtin_func_arg_type[this->type].c_type);
  snprintf(buf,0x400,"(*%s)[%d].get()",arg_list_name,(ulong)(uint)n);
  fprintf((FILE *)fp,builtin_func_arg_type[this->type].accessor,buf);
  fwrite(");\n",3,1,(FILE *)fp);
  return;
}

Assistant:

void BuiltinFuncArg::PrintCDef(FILE* fp, int n)
	{
	fprintf(fp, "\t%s %s = (%s) (", builtin_func_arg_type[type].c_type, name,
	        builtin_func_arg_type[type].c_type);

	char buf[1024];
	snprintf(buf, sizeof(buf), "(*%s)[%d].get()", arg_list_name, n);
	// Print the accessor expression.
	fprintf(fp, builtin_func_arg_type[type].accessor, buf);

	fprintf(fp, ");\n");
	}